

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  long in_FS_OFFSET;
  undefined1 local_38 [20];
  undefined1 *puStack_24;
  undefined4 uStack_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_4_ = 0xaaaaaaaa;
  puStack_24 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_1c._0_1_ = 0xaa;
  uStack_1c._1_1_ = 0xaa;
  uStack_1c._2_2_ = 0xaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  if (0 < n) {
    local_38._0_8_ = (sqlite3 *)0x0;
    puStack_24 = (undefined1 *)0x0;
    uStack_1c._0_1_ = '\0';
    uStack_1c._1_1_ = '\0';
    uStack_1c._2_2_ = 0xaaaa;
    local_38._8_8_ = zBuf;
    local_38._16_4_ = n;
    sqlite3_str_vappendf((sqlite3_str *)local_38,zFormat,ap);
    zBuf[(ulong)puStack_24 >> 0x20] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return zBuf;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap){
  StrAccum acc;
  if( n<=0 ) return zBuf;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( zBuf==0 || zFormat==0 ) {
    (void)SQLITE_MISUSE_BKPT;
    if( zBuf ) zBuf[0] = 0;
    return zBuf;
  }
#endif
  sqlite3StrAccumInit(&acc, 0, zBuf, n, 0);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  zBuf[acc.nChar] = 0;
  return zBuf;
}